

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit> *assumps)

{
  uint uVar1;
  FILE *f_00;
  bool bVar2;
  Var VVar3;
  ulong uVar4;
  char *pcVar5;
  int i;
  long lVar6;
  int i_1;
  int iVar7;
  int i_3;
  ulong *puVar8;
  lbool local_59;
  Var max;
  uint local_54;
  FILE *local_50;
  vec<int> map;
  
  if (this->ok != false) {
    max = 0;
    map.data = (int *)0x0;
    map.sz = 0;
    map.cap = 0;
    iVar7 = 0;
    for (lVar6 = 0; uVar4 = (ulong)(this->clauses).sz, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
      bVar2 = satisfied(this,(Clause *)
                             ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                             (this->clauses).data[lVar6]));
      iVar7 = iVar7 + (uint)!bVar2;
    }
    local_54 = iVar7;
    local_50 = (FILE *)f;
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      bVar2 = satisfied(this,(Clause *)
                             ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                             (this->clauses).data[lVar6]));
      if (!bVar2) {
        puVar8 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory +
                          (this->clauses).data[lVar6]);
        for (uVar4 = 0; uVar4 < *puVar8 >> 0x22; uVar4 = uVar4 + 1) {
          iVar7 = *(int *)((long)puVar8 + uVar4 * 4 + 8);
          local_59.value = (byte)iVar7 & 1 ^ (this->assigns).data[iVar7 >> 1].value;
          bVar2 = lbool::operator!=(&local_59,(lbool)0x1);
          if (bVar2) {
            mapVar(*(int *)((long)puVar8 + uVar4 * 4 + 8) >> 1,&map,&max);
          }
        }
      }
      uVar4 = (ulong)(uint)(this->clauses).sz;
    }
    local_54 = local_54 + (this->assumptions).sz;
    fprintf(local_50,"p cnf %d %d\n",(ulong)(uint)max);
    for (lVar6 = 0; f_00 = local_50, lVar6 < (this->assumptions).sz; lVar6 = lVar6 + 1) {
      uVar1 = (this->assumptions).data[lVar6].x;
      VVar3 = mapVar((int)uVar1 >> 1,&map,&max);
      pcVar5 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar5 = "";
      }
      fprintf(local_50,"%s%d 0\n",pcVar5,(ulong)(VVar3 + 1));
    }
    for (lVar6 = 0; lVar6 < (this->clauses).sz; lVar6 = lVar6 + 1) {
      toDimacs(this,(FILE *)f_00,
               (Clause *)
               ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar6])
               ,&map,&max);
    }
    if (0 < this->verbosity) {
      printf("c Wrote DIMACS with %d variables and %d clauses.\n",(ulong)(uint)max,(ulong)local_54);
    }
    vec<int>::~vec(&map);
    return;
  }
  fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec<Lit> &assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec<Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) cnt++;

    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False) mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for (int i = 0; i < clauses.size(); i++) toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0) printf("c Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}